

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

bool __thiscall
wallet::anon_unknown_5::WalletImpl::tryGetBalances
          (WalletImpl *this,WalletBalances *balances,uint256 *block_hash)

{
  element_type *peVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> locked_wallet;
  CAmount local_70;
  CAmount CStack_68;
  CAmount local_60;
  undefined8 uStack_58;
  CAmount local_50;
  CAmount CStack_48;
  CAmount local_40;
  unique_lock<std::recursive_mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_device =
       &(((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        cs_wallet).super_recursive_mutex;
  local_38._M_owns = false;
  std::unique_lock<std::recursive_mutex>::try_lock(&local_38);
  bVar9 = local_38._M_owns;
  if (local_38._M_owns == true) {
    peVar1 = (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (peVar1->m_last_block_processed_height < 0) {
      __assert_fail("m_last_block_processed_height >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                    ,0x3d7,"uint256 wallet::CWallet::GetLastBlockHash() const");
    }
    uVar2 = *(undefined4 *)(peVar1->m_last_block_processed).super_base_blob<256U>.m_data._M_elems;
    uVar3 = *(undefined4 *)
             ((peVar1->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 4);
    uVar4 = *(undefined4 *)
             ((peVar1->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8);
    uVar5 = *(undefined4 *)
             ((peVar1->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0xc);
    uVar6 = *(undefined4 *)
             ((peVar1->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x14);
    uVar7 = *(undefined4 *)
             ((peVar1->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18);
    uVar8 = *(undefined4 *)
             ((peVar1->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x1c);
    *(undefined4 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 0x10) =
         *(undefined4 *)
          ((peVar1->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10);
    *(undefined4 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 0x14) = uVar6;
    *(undefined4 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar7;
    *(undefined4 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 0x1c) = uVar8;
    *(undefined4 *)(block_hash->super_base_blob<256U>).m_data._M_elems = uVar2;
    *(undefined4 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 4) = uVar3;
    *(undefined4 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 8) = uVar4;
    *(undefined4 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 0xc) = uVar5;
    (*(this->super_Wallet)._vptr_Wallet[0x29])(&local_70,this);
    balances->immature_watch_only_balance = local_40;
    balances->watch_only_balance = local_50;
    balances->unconfirmed_watch_only_balance = CStack_48;
    balances->immature_balance = local_60;
    *(undefined8 *)&balances->have_watch_only = uStack_58;
    balances->balance = local_70;
    balances->unconfirmed_balance = CStack_68;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar9;
  }
  __stack_chk_fail();
}

Assistant:

bool tryGetBalances(WalletBalances& balances, uint256& block_hash) override
    {
        TRY_LOCK(m_wallet->cs_wallet, locked_wallet);
        if (!locked_wallet) {
            return false;
        }
        block_hash = m_wallet->GetLastBlockHash();
        balances = getBalances();
        return true;
    }